

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  bool bVar1;
  int iVar2;
  istream *piVar3;
  ostream *poVar4;
  ulong uVar5;
  ulong uVar6;
  char *pcVar7;
  int iVar8;
  int local_c8;
  int local_c4;
  int nbFloors;
  int width;
  int nbRounds;
  int exitFloor;
  int nbTotalClones;
  int nbAdditionalElevators;
  fixed_t f;
  undefined1 local_80 [8];
  elevators_t e;
  int iStack_60;
  int exitPos;
  int elevatorFloor;
  undefined1 local_50;
  undefined7 uStack_4f;
  int local_3c;
  int local_38;
  int nbElevators;
  int clonePos;
  int elevatorPos;
  
  piVar3 = (istream *)std::istream::operator>>((istream *)&std::cin,&local_c8);
  piVar3 = (istream *)std::istream::operator>>(piVar3,&local_c4);
  piVar3 = (istream *)std::istream::operator>>(piVar3,&nbFloors);
  piVar3 = (istream *)std::istream::operator>>(piVar3,&width);
  piVar3 = (istream *)
           std::istream::operator>>
                     (piVar3,(int *)((long)&e.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_end_of_storage + 4));
  piVar3 = (istream *)std::istream::operator>>(piVar3,&nbRounds);
  piVar3 = (istream *)std::istream::operator>>(piVar3,&exitFloor);
  std::istream::operator>>(piVar3,&local_3c);
  std::istream::ignore();
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_80,(long)local_3c + 1,
             (allocator_type *)&nbTotalClones);
  _iStack_60 = (undefined1 *)((ulong)_iStack_60 & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&nbTotalClones,(long)local_3c,
             (bool *)&stack0xffffffffffffffa0,(allocator_type *)&nbElevators);
  if (0 < local_3c) {
    iVar8 = 0;
    do {
      piVar3 = (istream *)std::istream::operator>>((istream *)&std::cin,&stack0xffffffffffffffa0);
      std::istream::operator>>(piVar3,&nbElevators);
      std::istream::ignore();
      *(int *)((long)local_80 + (long)iStack_60 * 4) = nbElevators;
      iVar8 = iVar8 + 1;
    } while (iVar8 < local_3c);
  }
  *(int *)((long)local_80 + (long)local_3c * 4) =
       e.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage._4_4_;
  iVar8 = -1;
  bVar1 = true;
  f.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage =
       (_Bit_pointer)0x800000000000003f;
  do {
    _iStack_60 = &local_50;
    _elevatorFloor = 0;
    local_50 = 0;
    piVar3 = (istream *)std::istream::operator>>((istream *)&std::cin,&nbElevators);
    piVar3 = (istream *)std::istream::operator>>(piVar3,&local_38);
    std::operator>>(piVar3,(string *)&stack0xffffffffffffffa0);
    std::istream::ignore();
    uVar6 = (ulong)nbElevators;
    if (uVar6 == 0xffffffffffffffff) {
LAB_001024b1:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"WAIT",4);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
      std::ostream::put(-0x70);
      std::ostream::flush();
    }
    else {
      uVar5 = uVar6 + 0x3f;
      if (-1 < (long)uVar6) {
        uVar5 = uVar6;
      }
      if ((_nbTotalClones
           [((long)uVar5 >> 6) +
            ((ulong)((uVar6 & (ulong)f.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                     super__Bvector_impl_data._M_end_of_storage) <
                    0x8000000000000001) - 1)] >> (uVar6 & 0x3f) & 1) != 0) goto LAB_001024b1;
      if (bVar1) {
        bVar1 = false;
        iVar8 = local_38;
      }
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,nbElevators);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"/",1);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      if (((local_38 < *(int *)((long)local_80 + (long)nbElevators * 4)) &&
          (iVar2 = std::__cxx11::string::compare((char *)&stack0xffffffffffffffa0), iVar2 == 0)) ||
         ((*(int *)((long)local_80 + (long)nbElevators * 4) < local_38 &&
          (iVar2 = std::__cxx11::string::compare((char *)&stack0xffffffffffffffa0), iVar2 == 0)))) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"WAIT",4);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
        std::ostream::put(-0x70);
        std::ostream::flush();
        uVar5 = (ulong)nbElevators;
        uVar6 = uVar5 + 0x3f;
        if (-1 < (long)uVar5) {
          uVar6 = uVar5;
        }
        _nbTotalClones
        [((long)uVar6 >> 6) +
         ((ulong)((uVar5 & (ulong)f.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                  super__Bvector_impl_data._M_end_of_storage) < 0x8000000000000001)
         - 1)] = _nbTotalClones
                 [((long)uVar6 >> 6) +
                  ((ulong)((uVar5 & (ulong)f.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                           super__Bvector_impl_data._M_end_of_storage) <
                          0x8000000000000001) - 1)] | 1L << ((byte)nbElevators & 0x3f);
      }
      else {
        if ((long)nbElevators < 1) {
LAB_001025f4:
          pcVar7 = "BLOCK";
          if (local_38 == iVar8 || nbElevators != 0) {
            pcVar7 = "WAIT";
          }
          uVar6 = (ulong)(local_38 == iVar8 || nbElevators != 0) ^ 5;
        }
        else {
          uVar6 = 5;
          pcVar7 = "BLOCK";
          if (local_38 == *(int *)((long)local_80 + ((long)nbElevators + -1) * 4))
          goto LAB_001025f4;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar7,uVar6);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
        std::ostream::put(-0x70);
        std::ostream::flush();
      }
    }
    if (_iStack_60 != &local_50) {
      operator_delete(_iStack_60,CONCAT71(uStack_4f,local_50) + 1);
    }
  } while( true );
}

Assistant:

int main()
{
    int nbFloors; // number of floors
    int width; // width of the area
    int nbRounds; // maximum number of rounds
    int exitFloor; // floor on which the exit is found
    int exitPos; // position of the exit on its floor
    int nbTotalClones; // number of generated clones
    int nbAdditionalElevators; // ignore (always zero)
    int nbElevators; // number of elevators
    cin >> nbFloors >> width >> nbRounds >> exitFloor >> exitPos >> nbTotalClones >> nbAdditionalElevators >> nbElevators; cin.ignore();
    
    typedef std::pair<int, int> pair_t;
    typedef std::vector<int> elevators_t;
    typedef std::vector<bool> fixed_t;
    
    elevators_t e(nbElevators + 1);
    fixed_t f(nbElevators, false);
    for (int i = 0; i < nbElevators; i++)
    {
        int elevatorFloor; // floor on which this elevator is found
        int elevatorPos; // position of the elevator on its floor
        cin >> elevatorFloor >> elevatorPos;
        cin.ignore();
        e[elevatorFloor] = elevatorPos;
    }
    e[nbElevators] = exitPos;
    
    bool first = true;
    int start = -1;
    while (1)
    {
        int cloneFloor; // floor of the leading clone
        int clonePos; // position of the leading clone on its floor
        string direction; // direction of the leading clone: LEFT or RIGHT
        cin >> cloneFloor >> clonePos >> direction; cin.ignore();

        if (-1 == cloneFloor || f[cloneFloor])
        {
            cout << "WAIT" << endl;
            continue;
        }
        if (first)
        {
            start = clonePos;
            first = false;
        }
        
        cerr << cloneFloor << "/" << e.size() << endl;
        if ((clonePos < e[cloneFloor] && direction == "RIGHT")
            || (clonePos > e[cloneFloor] && direction == "LEFT"))
        {
            cout << "WAIT" << endl;
            f[cloneFloor] = true;
        } else
        {
            if ((0 < cloneFloor && clonePos != e[cloneFloor - 1])
                || (0 == cloneFloor && clonePos != start))
            {
                cout << "BLOCK" << endl;
            }
            else
            {
                cout << "WAIT" << endl;
            }
        }
    }
}